

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimalControlProblem.cpp
# Opt level: O0

bool __thiscall
iDynTree::optimalcontrol::OptimalControlProblem::constraintsJacobianWRTControlSparsity
          (OptimalControlProblem *this,SparsityStructure *controlSparsity)

{
  ulong uVar1;
  bool bVar2;
  element_type *peVar3;
  size_t sVar4;
  ostream *poVar5;
  char *pcVar6;
  long lVar7;
  long *in_RDI;
  ostringstream errorMsg;
  size_t j;
  size_t i_1;
  size_t cols;
  size_t rows;
  size_t i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>
  *group;
  iterator __end2;
  iterator __begin2;
  ConstraintsGroupsMap *__range2;
  size_t offset;
  SparsityStructure *in_stack_fffffffffffffd68;
  SparsityStructure *in_stack_fffffffffffffd70;
  ostringstream *this_00;
  ConstraintsGroup *in_stack_fffffffffffffd78;
  SparsityStructure *in_stack_fffffffffffffd80;
  string local_250 [32];
  string local_230 [48];
  ostringstream local_200 [376];
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  NonZero local_68;
  NonZero local_58;
  ulong local_48;
  reference local_40;
  _Self local_38;
  _Self local_30;
  long local_28;
  long local_20;
  byte local_1;
  
  local_20 = 0;
  SparsityStructure::clear(in_stack_fffffffffffffd70);
  local_28 = *in_RDI + 0x28;
  local_30._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
                *)in_stack_fffffffffffffd68);
  local_38._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
       ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>_>
              *)in_stack_fffffffffffffd68);
  do {
    bVar2 = std::operator!=(&local_30,&local_38);
    if (!bVar2) {
      SparsityStructure::operator=(in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      local_1 = 1;
LAB_00301d21:
      return (bool)(local_1 & 1);
    }
    local_40 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
               ::operator*((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                            *)0x3018d8);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3018f1);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x3018f9);
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x30190f);
    bVar2 = ConstraintsGroup::constraintJacobianWRTControlSparsity
                      (in_stack_fffffffffffffd78,in_stack_fffffffffffffd70);
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x301938);
    peVar3->hasControlJacobianSparsity = bVar2;
    peVar3 = std::
             __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x301956);
    if ((peVar3->hasControlJacobianSparsity & 1U) == 0) {
      bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)(*in_RDI + 0x18));
      if (!bVar2) {
        this_00 = local_200;
        std::__cxx11::ostringstream::ostringstream(this_00);
        poVar5 = std::operator<<((ostream *)this_00,"The group ");
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x301bb7);
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::ConstraintsGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x301bbf);
        ConstraintsGroup::name_abi_cxx11_((ConstraintsGroup *)in_stack_fffffffffffffd68);
        poVar5 = std::operator<<(poVar5,local_230);
        std::operator<<(poVar5,
                        " has dense control jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown."
                       );
        std::__cxx11::string::~string(local_230);
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        iDynTree::reportError("OptimalControlProblem","constraintJacobianWRTControlSparsity",pcVar6)
        ;
        std::__cxx11::string::~string(local_250);
        local_1 = 0;
        std::__cxx11::ostringstream::~ostringstream(local_200);
        goto LAB_00301d21;
      }
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x301aa5);
      local_70 = iDynTree::MatrixDynSize::rows();
      std::
      __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x301aca);
      local_78 = iDynTree::MatrixDynSize::cols();
      for (local_80 = 0; local_80 < local_70; local_80 = local_80 + 1) {
        for (local_88 = 0; local_88 < local_78; local_88 = local_88 + 1) {
          SparsityStructure::add
                    (in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,
                     (size_t)in_stack_fffffffffffffd70);
        }
      }
    }
    else {
      local_48 = 0;
      while( true ) {
        uVar1 = local_48;
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x30198d);
        sVar4 = SparsityStructure::size((SparsityStructure *)0x30199c);
        if (sVar4 <= uVar1) break;
        in_stack_fffffffffffffd80 = (SparsityStructure *)(*in_RDI + 0x138);
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x3019d1);
        local_58 = SparsityStructure::operator[]
                             (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
        std::
        __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
        ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x301a1e);
        local_68 = SparsityStructure::operator[]
                             (in_stack_fffffffffffffd70,(size_t)in_stack_fffffffffffffd68);
        SparsityStructure::add
                  (in_stack_fffffffffffffd80,(size_t)in_stack_fffffffffffffd78,
                   (size_t)in_stack_fffffffffffffd70);
        local_48 = local_48 + 1;
      }
    }
    std::
    __shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<iDynTree::optimalcontrol::BufferedGroup,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x301ccf);
    lVar7 = iDynTree::MatrixDynSize::rows();
    local_20 = lVar7 + local_20;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<iDynTree::optimalcontrol::BufferedGroup>_>_>
                  *)in_stack_fffffffffffffd70);
  } while( true );
}

Assistant:

bool OptimalControlProblem::constraintsJacobianWRTControlSparsity(SparsityStructure &controlSparsity)
        {
            size_t offset = 0;
            m_pimpl->controlJacobianSparsity.clear();
            for (auto& group : m_pimpl->constraintsGroups){

                group.second->hasControlJacobianSparsity = group.second->group_ptr->constraintJacobianWRTControlSparsity(group.second->controlJacobianSparsity);

                if (group.second->hasControlJacobianSparsity) {

                    for (size_t i = 0; i < group.second->controlJacobianSparsity.size(); ++i) {
                        m_pimpl->controlJacobianSparsity.add(group.second->controlJacobianSparsity[i].row + offset,
                                                             group.second->controlJacobianSparsity[i].col);
                    }

                } else {

                    if (m_pimpl->dynamicalSystem) {

                        size_t rows = group.second->controlJacobianBuffer.rows();
                        size_t cols = group.second->controlJacobianBuffer.cols();

                        for (size_t i = 0; i < rows; ++i) {
                            for (size_t j = 0; j < cols; ++j) {
                                m_pimpl->controlJacobianSparsity.add(i + offset, j);
                            }
                        }
                    } else {
                        std::ostringstream errorMsg;
                        errorMsg << "The group " << group.second->group_ptr->name() <<" has dense control jacobian and no dynamical system has been provided yet. Cannot determine the sparsity since the control dimension is unknown.";
                        reportError("OptimalControlProblem", "constraintJacobianWRTControlSparsity", errorMsg.str().c_str());
                        return false;
                    }
                }

                offset += group.second->controlJacobianBuffer.rows();
            }

            controlSparsity = m_pimpl->controlJacobianSparsity;

            return true;
        }